

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O1

DecodeStatus DecodeL3RSrcDstInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint RegNo;
  uint uVar1;
  uint uVar2;
  DecodeStatus DVar3;
  void *Decoder_00;
  
  uVar1 = Insn >> 6 & 0x1f;
  if (uVar1 < 0x1b) {
    uVar2 = uVar1 / 3 + (uVar1 / 9) * -3;
    Decoder_00 = (void *)(ulong)uVar2;
    RegNo = (Insn >> 4 & 3) + (uVar1 % 3) * 4;
    DVar3 = MCDisassembler_Success;
    DecodeGRRegsRegisterClass(Inst,RegNo,Address,Decoder_00);
    DecodeGRRegsRegisterClass(Inst,RegNo,Address,Decoder_00);
    DecodeGRRegsRegisterClass(Inst,(Insn >> 2 & 3) + uVar2 * 4,Address,Decoder_00);
    DecodeGRRegsRegisterClass(Inst,(Insn & 3) + (uVar1 / 9) * 4,Address,Decoder_00);
  }
  else {
    DVar3 = MCDisassembler_Fail;
  }
  return DVar3;
}

Assistant:

static DecodeStatus DecodeL3RSrcDstInstruction(MCInst *Inst, unsigned Insn, uint64_t Address,
		const void *Decoder)
{
	unsigned Op1, Op2, Op3;
	DecodeStatus S =
		Decode3OpInstruction(fieldFromInstruction_4(Insn, 0, 16), &Op1, &Op2, &Op3);
	if (S == MCDisassembler_Success) {
		DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);
		DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);
		DecodeGRRegsRegisterClass(Inst, Op2, Address, Decoder);
		DecodeGRRegsRegisterClass(Inst, Op3, Address, Decoder);
	}

	return S;
}